

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  uint uVar1;
  upb_tabent *puVar2;
  upb_key tabkey;
  upb_value val_00;
  long lVar3;
  int iVar4;
  uint32_t hash;
  long lVar5;
  uintptr_t val;
  ulong uVar6;
  lookupkey_t key;
  upb_strtable new_table;
  
  iVar4 = init((EVP_PKEY_CTX *)&new_table);
  if (SUB41(iVar4,0) == false) {
    return false;
  }
  uVar6 = 0xffffffffffffffff;
  do {
    lVar3 = uVar6 * 0x18 + 0x20;
    do {
      lVar5 = lVar3;
      uVar6 = uVar6 + 1;
      if ((t->t).mask + 1 <= uVar6) {
        (t->t).entries = new_table.t.entries;
        (t->t).count = new_table.t.count;
        (t->t).mask = new_table.t.mask;
        return SUB41(iVar4,0);
      }
      puVar2 = (t->t).entries;
      tabkey = *(upb_key *)((long)&(puVar2->val).val + lVar5);
      lVar3 = lVar5 + 0x18;
    } while (tabkey.num == 0);
    uVar1 = (tabkey.str)->size;
    val_00.val = *(uint64_t *)((long)&puVar2[-1].next + lVar5);
    hash = _upb_Hash((void *)(tabkey.num + 4),(ulong)uVar1,0x3a0848);
    key.str.size._0_4_ = uVar1;
    key.str.data = (char *)(tabkey.num + 4);
    key.str.size._4_4_ = 0;
    insert(&new_table.t,key,tabkey,val_00,hash,strhash,streql);
  } while( true );
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView sv;
  upb_value val;
  while (upb_strtable_next2(t, &sv, &val, &iter)) {
    // Unlike normal insert, does not copy string data or possibly reallocate
    // the table
    // The data pointer used in the table is guaranteed to point at a
    // upb_SizePrefixString, we just need to back up by the size of the uint32_t
    // length prefix.
    const upb_SizePrefixString* keystr =
        (const upb_SizePrefixString*)(sv.data - sizeof(uint32_t));
    UPB_ASSERT(keystr->data == sv.data);
    UPB_ASSERT(keystr->size == sv.size);

    lookupkey_t lookupkey = {.str = sv};
    upb_key tabkey = {.str = keystr};
    uint32_t hash = _upb_Hash_NoSeed(sv.data, sv.size);
    insert(&new_table.t, lookupkey, tabkey, val, hash, &strhash, &streql);
  }
  *t = new_table;
  return true;
}